

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pNew_00;
  char *pcVar4;
  int fVerbose;
  int fMulti;
  int fAddOutputs;
  int fGiaSimple;
  int c;
  Gia_Man_t *pNew;
  Vec_Int_t *vBoxIds;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Wlc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  vBoxIds = (Vec_Int_t *)Wlc_AbcGetNtk(pAbc);
  pNew = (Gia_Man_t *)0x0;
  fMulti = 0;
  fVerbose = 0;
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
LAB_003a9483:
  iVar3 = Extra_UtilGetopt(argv_local._4_4_,&pNtk->pName,"comvh");
  if (iVar3 == -1) {
    if (vBoxIds == (Vec_Int_t *)0x0) {
      Abc_Print(1,"Abc_CommandBlast(): There is no current design.\n");
    }
    else {
      if ((bVar1) &&
         (pNew = (Gia_Man_t *)Wlc_NtkCollectMultipliers((Wlc_Ntk_t *)vBoxIds),
         pNew == (Gia_Man_t *)0x0)) {
        Abc_Print(1,"Warning:  There is no multipliers in the design.\n");
      }
      pNew_00 = Wlc_NtkBitBlast((Wlc_Ntk_t *)vBoxIds,(Vec_Int_t *)pNew,fMulti,fVerbose);
      Vec_IntFreeP((Vec_Int_t **)&pNew);
      if (pNew_00 == (Gia_Man_t *)0x0) {
        Abc_Print(1,"Abc_CommandBlast(): Bit-blasting has failed.\n");
      }
      else {
        Abc_FrameUpdateGia(pAStack_18,pNew_00);
      }
    }
    return 0;
  }
  switch(iVar3) {
  case 99:
    fMulti = fMulti ^ 1;
    goto LAB_003a9483;
  default:
    break;
  case 0x68:
    break;
  case 0x6d:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_003a9483;
  case 0x6f:
    fVerbose = fVerbose ^ 1;
    goto LAB_003a9483;
  case 0x76:
    goto switchD_003a94c1_caseD_76;
  }
  Abc_Print(-2,"usage: %%blast [-comvh]\n");
  Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
  pcVar4 = "no";
  if (fMulti != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",
            pcVar4);
  pcVar4 = "no";
  if (fVerbose != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,
            "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n",
            pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n"
            ,pcVar4);
  pcVar4 = "no";
  if (bVar2) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003a94c1_caseD_76:
  bVar2 = (bool)(bVar2 ^ 1);
  goto LAB_003a9483;
}

Assistant:

int Abc_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Vec_Int_t * vBoxIds = NULL;
    Gia_Man_t * pNew = NULL;
    int c, fGiaSimple = 0, fAddOutputs = 0, fMulti = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "comvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 'o':
            fAddOutputs ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    if ( fMulti )
    {
        vBoxIds = Wlc_NtkCollectMultipliers( pNtk );
        if ( vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no multipliers in the design.\n" );
    }
    // transform
    pNew = Wlc_NtkBitBlast( pNtk, vBoxIds, fGiaSimple, fAddOutputs );
    Vec_IntFreeP( &vBoxIds );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-comvh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n", fAddOutputs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}